

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O0

PatternGeneration * __thiscall
PatternGeneration::getFlatTexture(PatternGeneration *this,Scalar *color,int *imageSize)

{
  int *in_RCX;
  int iVar1;
  _InputArray local_70;
  _InputArray local_48;
  undefined1 local_29;
  int *imageSize_local;
  Scalar *color_local;
  PatternGeneration *this_local;
  Mat *flat;
  
  local_29 = 0;
  imageSize_local = imageSize;
  color_local = color;
  this_local = this;
  cv::Mat::Mat((Mat *)this,*in_RCX,*in_RCX,0x10,(Scalar_ *)imageSize);
  iVar1 = (int)imageSize;
  cv::_InputArray::_InputArray(&local_48,(Mat *)this);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_70,(Mat *)this);
  cv::cvtColor((cv *)&local_48,&local_70,(_OutputArray *)0x39,0,iVar1);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_70);
  cv::_InputArray::~_InputArray(&local_48);
  return this;
}

Assistant:

cv::Mat PatternGeneration::getFlatTexture(const cv::Scalar & color, const int & imageSize)
{
    cv::Mat flat(imageSize,imageSize,CV_8UC3,color);
    cvtColor(flat,flat,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return flat;
}